

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<std::array<double,_3UL>_> * __thiscall
tinyusdz::Attribute::get_value<std::array<double,3ul>>
          (optional<std::array<double,_3UL>_> *__return_storage_ptr__,Attribute *this)

{
  optional<std::array<double,_3UL>_> local_30;
  
  primvar::PrimVar::get_value<std::array<double,3ul>>(&local_30,&this->_var);
  __return_storage_ptr__->has_value_ = local_30.has_value_;
  if (local_30.has_value_ == true) {
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_30.contained._16_8_;
    *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
         local_30.contained.data.__align;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_30.contained._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }